

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

ssize_t __thiscall Bstrlib::CBString::read(CBString *this,int __fd,void *__buf,size_t __nbytes)

{
  bstring x;
  ssize_t sVar1;
  CBStringException *this_00;
  undefined4 in_register_00000034;
  CBStringException bstr__cppwrapper_exception;
  string local_58;
  CBStringException local_38;
  
  if (0 < (this->super_tagbstring).mlen) {
    x = bread((bNread)CONCAT44(in_register_00000034,__fd),__buf);
    if (x == (bstring)0x0) {
      (this->super_tagbstring).slen = 0;
      sVar1 = 0xffffffff;
    }
    else {
      operator=(this,x);
      bdestroy(x);
      sVar1 = 0;
    }
    return sVar1;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"CBString::Write protection error","");
  CBStringException::CBStringException(&local_38,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&local_38);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

int CBString::read (bNread readPtr, void * parm) {
	if (mlen <= 0) bstringThrow ("Write protection error");
	bstring b = bread (readPtr, parm);
	if (b == NULL) {
		slen = 0;
		return -1;
	}
	*this = *b;
	bdestroy (b);
	return 0;
}